

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression *
slang::ast::Expression::create
          (Compilation *compilation,ExpressionSyntax *syntax,ASTContext *ctx,
          bitmask<slang::ast::ASTFlags> extraFlags,Type *assignmentTarget)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  bitmask<slang::ast::ASTFlags> in_RCX;
  TaggedUnionExpressionSyntax *syntax_00;
  ExpressionSyntax *in_RDX;
  Compilation *in_RSI;
  bitmask<slang::ast::ASTFlags> in_RDI;
  ASTContext *in_R8;
  ASTContext *in_stack_00000028;
  ValueRangeExpressionSyntax *in_stack_00000030;
  Compilation *in_stack_00000038;
  AssignmentPatternExpressionSyntax *in_stack_00000040;
  Compilation *in_stack_00000048;
  ASTContext *in_stack_000000e0;
  BinaryExpressionSyntax *in_stack_000000e8;
  Compilation *in_stack_000000f0;
  Type *in_stack_00000100;
  ASTContext *in_stack_00000108;
  InsideExpressionSyntax *in_stack_00000110;
  Compilation *in_stack_00000118;
  Expression *result;
  ASTContext context;
  ASTContext *in_stack_000002e8;
  ExpressionOrDistSyntax *in_stack_000002f0;
  Compilation *in_stack_000002f8;
  Type *in_stack_000003c0;
  ASTContext *in_stack_000003c8;
  ConditionalExpressionSyntax *in_stack_000003d0;
  Compilation *in_stack_000003d8;
  Type *in_stack_00000440;
  ASTContext *in_stack_00000448;
  ConcatenationExpressionSyntax *in_stack_00000450;
  Compilation *in_stack_00000458;
  ASTContext *in_stack_00000468;
  MultipleConcatenationExpressionSyntax *in_stack_00000470;
  Compilation *in_stack_00000478;
  ASTContext *in_stack_00000768;
  StreamingConcatenationExpressionSyntax *in_stack_00000770;
  Compilation *in_stack_00000778;
  ASTContext *in_stack_00000978;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_00000980;
  InvocationExpressionSyntax *in_stack_00000988;
  NameSyntax *in_stack_00000990;
  Compilation *in_stack_00000998;
  ASTContext *in_stack_fffffffffffffe08;
  Compilation *in_stack_fffffffffffffe10;
  InvocationExpressionSyntax *in_stack_fffffffffffffe18;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe20;
  ASTContext *in_stack_fffffffffffffe28;
  SourceLocation in_stack_fffffffffffffe30;
  SourceLocation in_stack_fffffffffffffe38;
  Compilation *in_stack_fffffffffffffe40;
  ElementSelectExpressionSyntax *in_stack_fffffffffffffe48;
  Compilation *in_stack_fffffffffffffe50;
  LiteralExpressionSyntax *in_stack_fffffffffffffe60;
  ASTContext *in_stack_fffffffffffffe68;
  ASTContext *in_stack_fffffffffffffe78;
  Type *in_stack_fffffffffffffe80;
  Compilation *in_stack_fffffffffffffe88;
  SuperNewDefaultedArgsExpressionSyntax *in_stack_fffffffffffffe90;
  Compilation *in_stack_fffffffffffffe98;
  Type *in_stack_fffffffffffffea0;
  Compilation *in_stack_fffffffffffffea8;
  Type *in_stack_fffffffffffffeb0;
  Compilation *in_stack_fffffffffffffeb8;
  Compilation *in_stack_fffffffffffffec0;
  Compilation *in_stack_fffffffffffffec8;
  SignedCastExpressionSyntax *in_stack_fffffffffffffed0;
  Compilation *in_stack_fffffffffffffed8;
  ASTContext *in_stack_fffffffffffffee8;
  Type *in_stack_fffffffffffffef0;
  InvocationExpressionSyntax *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  byte bVar2;
  Compilation *in_stack_ffffffffffffff08;
  Type *in_stack_ffffffffffffff20;
  ASTContext *in_stack_ffffffffffffff28;
  Compilation *compilation_00;
  undefined1 in_stack_ffffffffffffff38 [16];
  Type *assignmentTarget_00;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff50 [16];
  bitmask<slang::ast::ASTFlags> local_90;
  bitmask<slang::ast::ASTFlags> local_88;
  bitmask<slang::ast::ASTFlags> local_80;
  Expression *local_78;
  ASTContext *in_stack_ffffffffffffff98;
  BinaryExpressionSyntax *in_stack_ffffffffffffffa0;
  Compilation *in_stack_ffffffffffffffa8;
  Type *in_stack_ffffffffffffffc8;
  ASTContext *in_stack_fffffffffffffff8;
  
  ASTContext::resetFlags((ASTContext *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
  compilation_00 = in_stack_ffffffffffffff38._0_8_;
  assignmentTarget_00 = in_stack_ffffffffffffff38._8_8_;
  syntax_00 = (TaggedUnionExpressionSyntax *)
              (ulong)(*(SyntaxKind *)&(in_RSI->super_BumpAllocator).head - AddAssignmentExpression);
  switch(syntax_00) {
  case (TaggedUnionExpressionSyntax *)0x0:
  case (TaggedUnionExpressionSyntax *)0x6:
  case (TaggedUnionExpressionSyntax *)0xd:
  case (TaggedUnionExpressionSyntax *)0xe:
  case (TaggedUnionExpressionSyntax *)0x1a:
  case (TaggedUnionExpressionSyntax *)0x95:
  case (TaggedUnionExpressionSyntax *)0x112:
  case (TaggedUnionExpressionSyntax *)0x114:
  case (TaggedUnionExpressionSyntax *)0x124:
  case (TaggedUnionExpressionSyntax *)0x131:
  case (TaggedUnionExpressionSyntax *)0x145:
  case (TaggedUnionExpressionSyntax *)0x14a:
  case (TaggedUnionExpressionSyntax *)0x1bd:
  case (TaggedUnionExpressionSyntax *)0x211:
    slang::syntax::SyntaxNode::as<slang::syntax::BinaryExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = AssignmentExpression::fromSyntax
                         (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
    break;
  case (TaggedUnionExpressionSyntax *)0x1:
  case (TaggedUnionExpressionSyntax *)0xf:
  case (TaggedUnionExpressionSyntax *)0x10:
  case (TaggedUnionExpressionSyntax *)0x23:
  case (TaggedUnionExpressionSyntax *)0x28:
  case (TaggedUnionExpressionSyntax *)0x29:
  case (TaggedUnionExpressionSyntax *)0x2a:
  case (TaggedUnionExpressionSyntax *)0x35:
  case (TaggedUnionExpressionSyntax *)0x37:
  case (TaggedUnionExpressionSyntax *)0x96:
  case (TaggedUnionExpressionSyntax *)0xb4:
  case (TaggedUnionExpressionSyntax *)0xda:
  case (TaggedUnionExpressionSyntax *)0xdb:
  case (TaggedUnionExpressionSyntax *)0xf4:
  case (TaggedUnionExpressionSyntax *)0x104:
  case (TaggedUnionExpressionSyntax *)0x105:
  case (TaggedUnionExpressionSyntax *)0x10f:
  case (TaggedUnionExpressionSyntax *)0x110:
  case (TaggedUnionExpressionSyntax *)0x111:
  case (TaggedUnionExpressionSyntax *)0x113:
  case (TaggedUnionExpressionSyntax *)0x115:
  case (TaggedUnionExpressionSyntax *)0x116:
  case (TaggedUnionExpressionSyntax *)0x125:
  case (TaggedUnionExpressionSyntax *)0x132:
  case (TaggedUnionExpressionSyntax *)0x16d:
  case (TaggedUnionExpressionSyntax *)0x1be:
  case (TaggedUnionExpressionSyntax *)0x206:
  case (TaggedUnionExpressionSyntax *)0x207:
    slang::syntax::SyntaxNode::as<slang::syntax::BinaryExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = BinaryExpression::fromSyntax
                         (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98);
    break;
  default:
    bVar1 = slang::syntax::NameSyntax::isKind(*(SyntaxKind *)&(in_RSI->super_BumpAllocator).head);
    if (bVar1) {
      slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>((SyntaxNode *)in_RSI);
      local_78 = bindName(in_stack_00000998,in_stack_00000990,in_stack_00000988,in_stack_00000980,
                          in_stack_00000978);
    }
    else {
      bVar1 = slang::syntax::DataTypeSyntax::isKind
                        (*(SyntaxKind *)&(in_RSI->super_BumpAllocator).head);
      if (bVar1) {
        slang::syntax::SyntaxNode::as<slang::syntax::DataTypeSyntax>((SyntaxNode *)in_RSI);
        local_78 = DataTypeExpression::fromSyntax
                             (in_stack_fffffffffffffea8,(DataTypeSyntax *)in_stack_fffffffffffffea0,
                              (ASTContext *)in_stack_fffffffffffffe98);
      }
    }
    break;
  case (TaggedUnionExpressionSyntax *)0x13:
    slang::syntax::SyntaxNode::as<slang::syntax::ArrayOrRandomizeMethodExpressionSyntax>
              ((SyntaxNode *)in_RSI);
    local_78 = CallExpression::fromSyntax
                         ((Compilation *)in_RDI.m_bits,
                          (ArrayOrRandomizeMethodExpressionSyntax *)in_stack_fffffffffffffe20.m_bits
                          ,(ASTContext *)in_stack_fffffffffffffe18);
    break;
  case (TaggedUnionExpressionSyntax *)0x1b:
    slang::syntax::SyntaxNode::as<slang::syntax::AssignmentPatternExpressionSyntax>
              ((SyntaxNode *)in_RSI);
    local_78 = bindAssignmentPattern
                         (in_stack_00000048,in_stack_00000040,(ASTContext *)in_stack_00000038,
                          (Type *)in_stack_00000030);
    break;
  case (TaggedUnionExpressionSyntax *)0x20:
    local_78 = badExpr(in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
    break;
  case (TaggedUnionExpressionSyntax *)0x3a:
    slang::syntax::SyntaxNode::as<slang::syntax::CastExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = ConversionExpression::fromSyntax
                         (in_stack_00000118,(CastExpressionSyntax *)in_stack_00000110,
                          in_stack_00000108,in_stack_00000100);
    break;
  case (TaggedUnionExpressionSyntax *)0x50:
    slang::syntax::SyntaxNode::as<slang::syntax::ConcatenationExpressionSyntax>
              ((SyntaxNode *)in_RSI);
    local_78 = ConcatenationExpression::fromSyntax
                         (in_stack_00000458,in_stack_00000450,in_stack_00000448,in_stack_00000440);
    break;
  case (TaggedUnionExpressionSyntax *)0x53:
    slang::syntax::SyntaxNode::as<slang::syntax::ConditionalExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = ConditionalExpression::fromSyntax
                         (in_stack_000003d8,in_stack_000003d0,in_stack_000003c8,in_stack_000003c0);
    break;
  case (TaggedUnionExpressionSyntax *)0x63:
    slang::syntax::SyntaxNode::as<slang::syntax::CopyClassExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = CopyClassExpression::fromSyntax
                         (in_stack_fffffffffffffe88,
                          (CopyClassExpressionSyntax *)in_stack_fffffffffffffe80,
                          in_stack_fffffffffffffe78);
    break;
  case (TaggedUnionExpressionSyntax *)0x7e:
    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe60);
    sourceRange_00.endLoc = in_stack_fffffffffffffe38;
    sourceRange_00.startLoc = in_stack_fffffffffffffe30;
    ASTContext::addDiag(in_stack_fffffffffffffe28,SUB84((ulong)in_stack_fffffffffffffe40 >> 0x20,0),
                        sourceRange_00);
    local_78 = badExpr(in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
    break;
  case (TaggedUnionExpressionSyntax *)0xa0:
    slang::syntax::SyntaxNode::as<slang::syntax::ElementSelectExpressionSyntax>
              ((SyntaxNode *)in_RSI);
    local_78 = bindSelectExpression
                         (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                          (ASTContext *)in_stack_fffffffffffffe40);
    break;
  case (TaggedUnionExpressionSyntax *)0xab:
    slang::syntax::SyntaxNode::as<slang::syntax::EmptyQueueExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = ConcatenationExpression::fromEmpty
                         (in_stack_fffffffffffffeb8,
                          (EmptyQueueExpressionSyntax *)in_stack_fffffffffffffeb0,
                          (ASTContext *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    break;
  case (TaggedUnionExpressionSyntax *)0xc0:
    slang::syntax::SyntaxNode::as<slang::syntax::ExpressionOrDistSyntax>((SyntaxNode *)in_RSI);
    local_78 = DistExpression::fromSyntax(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8);
    break;
  case (TaggedUnionExpressionSyntax *)0xf6:
    slang::syntax::SyntaxNode::as<slang::syntax::InsideExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = InsideExpression::fromSyntax(in_stack_00000118,in_stack_00000110,in_stack_00000108);
    break;
  case (TaggedUnionExpressionSyntax *)0xfa:
    slang::syntax::SyntaxNode::as<slang::syntax::LiteralExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = IntegerLiteral::fromSyntax
                         ((Compilation *)
                          CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                          (LiteralExpressionSyntax *)in_stack_fffffffffffffef8);
    break;
  case (TaggedUnionExpressionSyntax *)0xfc:
    slang::syntax::SyntaxNode::as<slang::syntax::IntegerVectorExpressionSyntax>
              ((SyntaxNode *)in_RSI);
    local_78 = IntegerLiteral::fromSyntax
                         (in_stack_fffffffffffffec0,
                          (IntegerVectorExpressionSyntax *)in_stack_fffffffffffffeb8);
    break;
  case (TaggedUnionExpressionSyntax *)0x102:
    slang::syntax::SyntaxNode::as<slang::syntax::InvocationExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = CallExpression::fromSyntax
                         ((Compilation *)in_stack_fffffffffffffe20.m_bits,in_stack_fffffffffffffe18,
                          (ArrayOrRandomizeMethodExpressionSyntax *)in_stack_fffffffffffffe10,
                          in_stack_fffffffffffffe08);
    if (local_78->syntax != (ExpressionSyntax *)0x0) {
      return local_78;
    }
    break;
  case (TaggedUnionExpressionSyntax *)0x122:
    slang::syntax::SyntaxNode::as<slang::syntax::MemberAccessExpressionSyntax>((SyntaxNode *)in_RSI)
    ;
    local_78 = MemberAccessExpression::fromSyntax
                         (in_stack_ffffffffffffff08,
                          (MemberAccessExpressionSyntax *)
                          CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffef8,
                          (ArrayOrRandomizeMethodExpressionSyntax *)in_stack_fffffffffffffef0,
                          in_stack_fffffffffffffee8);
    break;
  case (TaggedUnionExpressionSyntax *)0x123:
    slang::syntax::SyntaxNode::as<slang::syntax::MinTypMaxExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = MinTypMaxExpression::fromSyntax
                         (in_stack_ffffffffffffff08,
                          (MinTypMaxExpressionSyntax *)
                          CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                          (ASTContext *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    break;
  case (TaggedUnionExpressionSyntax *)0x130:
    slang::syntax::SyntaxNode::as<slang::syntax::MultipleConcatenationExpressionSyntax>
              ((SyntaxNode *)in_RSI);
    local_78 = ReplicationExpression::fromSyntax
                         (in_stack_00000478,in_stack_00000470,in_stack_00000468);
    break;
  case (TaggedUnionExpressionSyntax *)0x140:
    slang::syntax::SyntaxNode::as<slang::syntax::NewArrayExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = NewArrayExpression::fromSyntax
                         (in_stack_fffffffffffffec8,
                          (NewArrayExpressionSyntax *)in_stack_fffffffffffffec0,
                          (ASTContext *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    break;
  case (TaggedUnionExpressionSyntax *)0x141:
    slang::syntax::SyntaxNode::as<slang::syntax::NewClassExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = NewClassExpression::fromSyntax
                         (in_stack_ffffffffffffff50._8_8_,in_stack_ffffffffffffff50._0_8_,
                          (ASTContext *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          assignmentTarget_00);
    break;
  case (TaggedUnionExpressionSyntax *)0x147:
    slang::syntax::SyntaxNode::as<slang::syntax::LiteralExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = NullLiteral::fromSyntax
                         ((Compilation *)in_stack_fffffffffffffe30,
                          (LiteralExpressionSyntax *)in_stack_fffffffffffffe28);
    break;
  case (TaggedUnionExpressionSyntax *)0x161:
    bitmask<slang::ast::ASTFlags>::bitmask(&local_80,NonProcedural);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe20.m_bits,
                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe18);
    bVar2 = 0;
    if (!bVar1) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_88,AssignmentDisallowed);
      bVar1 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe20.m_bits,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe18);
      bVar2 = bVar1 ^ 0xff;
    }
    if ((bVar2 & 1) != 0) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_90,AssignmentAllowed);
      bitmask<slang::ast::ASTFlags>::operator|=
                ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffff0,&local_90);
    }
    slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>
              ((SyntaxNode *)in_RSI);
    not_null<slang::syntax::ExpressionSyntax_*>::operator*
              ((not_null<slang::syntax::ExpressionSyntax_*> *)0x98da10);
    local_78 = create(in_RSI,in_RDX,in_R8,in_RDI,in_stack_ffffffffffffffc8);
    break;
  case (TaggedUnionExpressionSyntax *)0x16b:
  case (TaggedUnionExpressionSyntax *)0x16c:
    slang::syntax::SyntaxNode::as<slang::syntax::PostfixUnaryExpressionSyntax>((SyntaxNode *)in_RSI)
    ;
    local_78 = UnaryExpression::fromSyntax
                         (in_stack_ffffffffffffff50._8_8_,in_stack_ffffffffffffff50._0_8_,
                          (ASTContext *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    break;
  case (TaggedUnionExpressionSyntax *)0x187:
    slang::syntax::SyntaxNode::as<slang::syntax::LiteralExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = RealLiteral::fromSyntax
                         ((Compilation *)in_stack_fffffffffffffe30,
                          (LiteralExpressionSyntax *)in_stack_fffffffffffffe28);
    break;
  case (TaggedUnionExpressionSyntax *)0x1a4:
    slang::syntax::SyntaxNode::as<slang::syntax::SignedCastExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = ConversionExpression::fromSyntax
                         (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                          (ASTContext *)in_stack_fffffffffffffec8);
    break;
  case (TaggedUnionExpressionSyntax *)0x1b5:
    slang::syntax::SyntaxNode::as<slang::syntax::StreamingConcatenationExpressionSyntax>
              ((SyntaxNode *)in_RSI);
    local_78 = StreamingConcatenationExpression::fromSyntax
                         (in_stack_00000778,in_stack_00000770,in_stack_00000768);
    break;
  case (TaggedUnionExpressionSyntax *)0x1b6:
    slang::syntax::SyntaxNode::as<slang::syntax::LiteralExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = StringLiteral::fromSyntax
                         (in_stack_fffffffffffffff8,(LiteralExpressionSyntax *)in_RCX.m_bits);
    break;
  case (TaggedUnionExpressionSyntax *)0x1c0:
    slang::syntax::SyntaxNode::as<slang::syntax::SuperNewDefaultedArgsExpressionSyntax>
              ((SyntaxNode *)in_RSI);
    local_78 = NewClassExpression::fromSyntax
                         (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                          (ASTContext *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    break;
  case (TaggedUnionExpressionSyntax *)0x1c4:
    slang::syntax::SyntaxNode::as<slang::syntax::TaggedUnionExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = TaggedUnionExpression::fromSyntax
                         (compilation_00,syntax_00,in_stack_ffffffffffffff28,
                          in_stack_ffffffffffffff20);
    break;
  case (TaggedUnionExpressionSyntax *)0x1c8:
    slang::syntax::SyntaxNode::as<slang::syntax::LiteralExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = TimeLiteral::fromSyntax
                         ((ASTContext *)in_stack_fffffffffffffe50,
                          (LiteralExpressionSyntax *)in_stack_fffffffffffffe48);
    break;
  case (TaggedUnionExpressionSyntax *)0x1ce:
    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe60);
    sourceRange.endLoc = in_stack_fffffffffffffe38;
    sourceRange.startLoc = in_stack_fffffffffffffe30;
    ASTContext::addDiag(in_stack_fffffffffffffe28,SUB84((ulong)in_stack_fffffffffffffe40 >> 0x20,0),
                        sourceRange);
    local_78 = badExpr(in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
    break;
  case (TaggedUnionExpressionSyntax *)0x1e1:
  case (TaggedUnionExpressionSyntax *)0x1e2:
  case (TaggedUnionExpressionSyntax *)0x1e3:
  case (TaggedUnionExpressionSyntax *)0x1e4:
  case (TaggedUnionExpressionSyntax *)0x1e5:
  case (TaggedUnionExpressionSyntax *)0x1e6:
  case (TaggedUnionExpressionSyntax *)0x1e7:
  case (TaggedUnionExpressionSyntax *)0x1e9:
  case (TaggedUnionExpressionSyntax *)0x1ea:
  case (TaggedUnionExpressionSyntax *)0x1eb:
  case (TaggedUnionExpressionSyntax *)0x1ec:
  case (TaggedUnionExpressionSyntax *)0x1ed:
    slang::syntax::SyntaxNode::as<slang::syntax::PrefixUnaryExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = UnaryExpression::fromSyntax
                         (in_stack_ffffffffffffffa8,
                          (PrefixUnaryExpressionSyntax *)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98);
    break;
  case (TaggedUnionExpressionSyntax *)0x1f0:
    slang::syntax::SyntaxNode::as<slang::syntax::LiteralExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = UnbasedUnsizedIntegerLiteral::fromSyntax
                         (in_stack_fffffffffffffe40,
                          (LiteralExpressionSyntax *)in_stack_fffffffffffffe38);
    break;
  case (TaggedUnionExpressionSyntax *)0x1fb:
    slang::syntax::SyntaxNode::as<slang::syntax::ValueRangeExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = ValueRangeExpression::fromSyntax
                         (in_stack_00000038,in_stack_00000030,in_stack_00000028);
    break;
  case (TaggedUnionExpressionSyntax *)0x208:
    slang::syntax::SyntaxNode::as<slang::syntax::LiteralExpressionSyntax>((SyntaxNode *)in_RSI);
    local_78 = UnboundedLiteral::fromSyntax(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  }
  local_78->syntax = (ExpressionSyntax *)in_RSI;
  return local_78;
}

Assistant:

Expression& Expression::create(Compilation& compilation, const ExpressionSyntax& syntax,
                               const ASTContext& ctx, bitmask<ASTFlags> extraFlags,
                               const Type* assignmentTarget) {
    ASTContext context = ctx.resetFlags(extraFlags);
    Expression* result;
    switch (syntax.kind) {
        case SyntaxKind::BadExpression:
            result = &badExpr(compilation, nullptr);
            break;
        case SyntaxKind::NullLiteralExpression:
            result = &NullLiteral::fromSyntax(compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::WildcardLiteralExpression:
            result = &UnboundedLiteral::fromSyntax(context, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::StringLiteralExpression:
            result = &StringLiteral::fromSyntax(context, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::RealLiteralExpression:
            result = &RealLiteral::fromSyntax(compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::TimeLiteralExpression:
            result = &TimeLiteral::fromSyntax(context, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::IntegerLiteralExpression:
            result = &IntegerLiteral::fromSyntax(compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::UnbasedUnsizedLiteralExpression:
            result = &UnbasedUnsizedIntegerLiteral::fromSyntax(
                compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::IntegerVectorExpression:
            result = &IntegerLiteral::fromSyntax(compilation,
                                                 syntax.as<IntegerVectorExpressionSyntax>());
            break;
        case SyntaxKind::ParenthesizedExpression:
            // Parenthesis re-allows assignments if we're in a procedural statement.
            if (!context.flags.has(ASTFlags::NonProcedural) &&
                !context.flags.has(ASTFlags::AssignmentDisallowed)) {
                extraFlags |= ASTFlags::AssignmentAllowed;
            }

            result = &create(compilation, *syntax.as<ParenthesizedExpressionSyntax>().expression,
                             context, extraFlags, assignmentTarget);
            break;
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryMinusExpression:
        case SyntaxKind::UnaryBitwiseNotExpression:
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
        case SyntaxKind::UnaryLogicalNotExpression:
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnaryPredecrementExpression:
            result = &UnaryExpression::fromSyntax(compilation,
                                                  syntax.as<PrefixUnaryExpressionSyntax>(),
                                                  context);
            break;
        case SyntaxKind::PostincrementExpression:
        case SyntaxKind::PostdecrementExpression:
            result = &UnaryExpression::fromSyntax(compilation,
                                                  syntax.as<PostfixUnaryExpressionSyntax>(),
                                                  context);
            break;
        case SyntaxKind::AddExpression:
        case SyntaxKind::SubtractExpression:
        case SyntaxKind::MultiplyExpression:
        case SyntaxKind::DivideExpression:
        case SyntaxKind::ModExpression:
        case SyntaxKind::BinaryAndExpression:
        case SyntaxKind::BinaryOrExpression:
        case SyntaxKind::BinaryXorExpression:
        case SyntaxKind::BinaryXnorExpression:
        case SyntaxKind::EqualityExpression:
        case SyntaxKind::InequalityExpression:
        case SyntaxKind::CaseEqualityExpression:
        case SyntaxKind::CaseInequalityExpression:
        case SyntaxKind::GreaterThanEqualExpression:
        case SyntaxKind::GreaterThanExpression:
        case SyntaxKind::LessThanEqualExpression:
        case SyntaxKind::LessThanExpression:
        case SyntaxKind::WildcardEqualityExpression:
        case SyntaxKind::WildcardInequalityExpression:
        case SyntaxKind::LogicalAndExpression:
        case SyntaxKind::LogicalOrExpression:
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::LogicalShiftLeftExpression:
        case SyntaxKind::LogicalShiftRightExpression:
        case SyntaxKind::ArithmeticShiftLeftExpression:
        case SyntaxKind::ArithmeticShiftRightExpression:
        case SyntaxKind::PowerExpression:
            result = &BinaryExpression::fromSyntax(compilation, syntax.as<BinaryExpressionSyntax>(),
                                                   context);
            break;
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::XorAssignmentExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
            result = &AssignmentExpression::fromSyntax(compilation,
                                                       syntax.as<BinaryExpressionSyntax>(),
                                                       context);
            break;
        case SyntaxKind::InvocationExpression:
            result = &CallExpression::fromSyntax(compilation,
                                                 syntax.as<InvocationExpressionSyntax>(), nullptr,
                                                 context);

            // The syntax node might have already been assigned after creating the
            // call expression, for cases like let decls that get expanded in place.
            // Return early to avoid overwriting that syntax node.
            if (result->syntax)
                return *result;
            break;
        case SyntaxKind::ConditionalExpression:
            result = &ConditionalExpression::fromSyntax(compilation,
                                                        syntax.as<ConditionalExpressionSyntax>(),
                                                        context, assignmentTarget);
            break;
        case SyntaxKind::InsideExpression:
            result = &InsideExpression::fromSyntax(compilation, syntax.as<InsideExpressionSyntax>(),
                                                   context);
            break;
        case SyntaxKind::MemberAccessExpression:
            result = &MemberAccessExpression::fromSyntax(compilation,
                                                         syntax.as<MemberAccessExpressionSyntax>(),
                                                         nullptr, nullptr, context);
            break;
        case SyntaxKind::ConcatenationExpression:
            result = &ConcatenationExpression::fromSyntax(
                compilation, syntax.as<ConcatenationExpressionSyntax>(), context, assignmentTarget);
            break;
        case SyntaxKind::EmptyQueueExpression:
            result = &ConcatenationExpression::fromEmpty(compilation,
                                                         syntax.as<EmptyQueueExpressionSyntax>(),
                                                         context, assignmentTarget);
            break;
        case SyntaxKind::MultipleConcatenationExpression:
            result = &ReplicationExpression::fromSyntax(
                compilation, syntax.as<MultipleConcatenationExpressionSyntax>(), context);
            break;
        case SyntaxKind::StreamingConcatenationExpression:
            result = &StreamingConcatenationExpression::fromSyntax(
                compilation, syntax.as<StreamingConcatenationExpressionSyntax>(), context);
            break;
        case SyntaxKind::ElementSelectExpression:
            result = &bindSelectExpression(compilation, syntax.as<ElementSelectExpressionSyntax>(),
                                           context);
            break;
        case SyntaxKind::CastExpression:
            result = &ConversionExpression::fromSyntax(compilation,
                                                       syntax.as<CastExpressionSyntax>(), context,
                                                       assignmentTarget);
            break;
        case SyntaxKind::SignedCastExpression:
            result = &ConversionExpression::fromSyntax(compilation,
                                                       syntax.as<SignedCastExpressionSyntax>(),
                                                       context);
            break;
        case SyntaxKind::AssignmentPatternExpression:
            result = &bindAssignmentPattern(compilation,
                                            syntax.as<AssignmentPatternExpressionSyntax>(), context,
                                            assignmentTarget);
            break;
        case SyntaxKind::ValueRangeExpression:
            result = &ValueRangeExpression::fromSyntax(compilation,
                                                       syntax.as<ValueRangeExpressionSyntax>(),
                                                       context);
            break;
        case SyntaxKind::ExpressionOrDist:
            result = &DistExpression::fromSyntax(compilation, syntax.as<ExpressionOrDistSyntax>(),
                                                 context);
            break;
        case SyntaxKind::TimingControlExpression:
            // Valid cases of this expression type are handled in AssignmentExpression.
            // If we reach this block here, the expression is invalid so always report
            // an error.
            context.addDiag(diag::TimingControlNotAllowed, syntax.sourceRange());
            result = &badExpr(compilation, nullptr);
            break;
        case SyntaxKind::NewArrayExpression:
            result = &NewArrayExpression::fromSyntax(compilation,
                                                     syntax.as<NewArrayExpressionSyntax>(), context,
                                                     assignmentTarget);
            break;
        case SyntaxKind::NewClassExpression:
            result = &NewClassExpression::fromSyntax(compilation,
                                                     syntax.as<NewClassExpressionSyntax>(), context,
                                                     assignmentTarget);
            break;
        case SyntaxKind::SuperNewDefaultedArgsExpression:
            result = &NewClassExpression::fromSyntax(
                compilation, syntax.as<SuperNewDefaultedArgsExpressionSyntax>(), context,
                assignmentTarget);
            break;
        case SyntaxKind::CopyClassExpression:
            result = &CopyClassExpression::fromSyntax(compilation,
                                                      syntax.as<CopyClassExpressionSyntax>(),
                                                      context);
            break;
        case SyntaxKind::DefaultPatternKeyExpression:
            // This should not be reachable from any valid expression creation.
            context.addDiag(diag::ExpectedExpression, syntax.sourceRange());
            result = &badExpr(compilation, nullptr);
            break;
        case SyntaxKind::MinTypMaxExpression:
            result = &MinTypMaxExpression::fromSyntax(compilation,
                                                      syntax.as<MinTypMaxExpressionSyntax>(),
                                                      context, assignmentTarget);
            break;
        case SyntaxKind::ArrayOrRandomizeMethodExpression:
            result = &CallExpression::fromSyntax(
                compilation, syntax.as<ArrayOrRandomizeMethodExpressionSyntax>(), context);
            break;
        case SyntaxKind::TaggedUnionExpression:
            result = &TaggedUnionExpression::fromSyntax(compilation,
                                                        syntax.as<TaggedUnionExpressionSyntax>(),
                                                        context, assignmentTarget);
            break;
        default:
            if (NameSyntax::isKind(syntax.kind)) {
                result = &bindName(compilation, syntax.as<NameSyntax>(), nullptr, nullptr, context);
                break;
            }
            else if (DataTypeSyntax::isKind(syntax.kind)) {
                result = &DataTypeExpression::fromSyntax(compilation, syntax.as<DataTypeSyntax>(),
                                                         context);
                break;
            }
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}